

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# readdata.cpp
# Opt level: O3

int __thiscall ReadData::ReadSocketData(ReadData *this,BUFF *buff,int desc)

{
  int i;
  long lVar1;
  ssize_t sVar2;
  int iVar3;
  uint uVar4;
  uchar tmp [1024];
  undefined1 auStack_428 [1024];
  
  iVar3 = buff->pos;
  lVar1 = (long)iVar3;
  if (lVar1 == 0) {
    iVar3 = 0;
    do {
      memset(auStack_428,0,0x400);
      sVar2 = recv(desc,auStack_428,0x400,0);
      uVar4 = (uint)sVar2;
      if (0 < (int)uVar4) {
        memcpy(buff->buff + iVar3,auStack_428,(ulong)(uVar4 & 0x7fffffff));
        iVar3 = iVar3 + uVar4;
      }
    } while (iVar3 < 0x7698);
    buff->len = iVar3;
    buff->pos = 0;
    return 0;
  }
  do {
    *(uchar *)((long)buff + (lVar1 - iVar3)) = buff->buff[lVar1];
    lVar1 = lVar1 + 1;
    iVar3 = buff->pos;
  } while( true );
}

Assistant:

int ReadData::ReadSocketData(BUFF &buff, int desc) {
    // 将数据先读入缓冲区
    if(buff.pos != 0)
        reset(buff);
    int count = buff.pos;
    try
    {
        while (count < MAXDATALEN)
        {
            unsigned char tmp[1024];
            memset(tmp, 0x00, 1024);
            int num = recv(desc, tmp, 1024, 0);
            for(int i = 0; i < num; ++i)
                buff.buff[count++] = tmp[i];
            // buff[count] = tmp;
        }
        buff.len = count;
        buff.pos = 0;
        return 0;
    }
    catch(...)
    {
        cout << "error happened when getting data from socket" << endl;
        return UNKNOWN_ERROR;
    } 
}